

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

bool kj::_::pollImpl(PromiseNode *node,WaitScope *waitScope,SourceLocation location)

{
  undefined8 this;
  bool bVar1;
  bool runnable;
  long *in_FS_OFFSET;
  Type local_168;
  Type local_150;
  undefined1 local_148 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2082:3)>
  _kjDefer2082;
  undefined1 local_118 [8];
  RootEvent doneEvent;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  undefined1 local_a0 [8];
  DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> _kjCondition_1;
  Fault local_68;
  Fault f;
  DebugExpression<kj::EventLoop*> local_58 [8];
  undefined1 local_50 [8];
  DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> _kjCondition;
  EventLoop *loop;
  WaitScope *waitScope_local;
  PromiseNode *node_local;
  
  f.exception = (Exception *)waitScope->loop;
  _kjCondition._32_8_ = f.exception;
  local_58 = (DebugExpression<kj::EventLoop*>  [8])
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&MAGIC_ASSERT,(EventLoop **)&f);
  DebugExpression<kj::EventLoop*>::operator==
            ((DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)local_50,local_58,
             (EventLoop **)(*in_FS_OFFSET + -0x28));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81a,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",
               (DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)local_50,
               (char (*) [37])"WaitScope not valid for this thread.");
    Debug::Fault::fatal(&local_68);
  }
  f_1.exception =
       (Exception *)
       DebugExpressionStart::operator<<((DebugExpressionStart *)&MAGIC_ASSERT,&waitScope->fiber);
  DebugExpression<kj::Maybe<kj::_::FiberBase&>&>::operator==
            ((DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)local_a0,
             (DebugExpression<kj::Maybe<kj::_::FiberBase&>&> *)&f_1,(None *)&kj::none);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (bVar1) {
    f_2.exception._6_1_ = (*(byte *)(_kjCondition._32_8_ + 8) ^ 0xff) & 1;
    f_2.exception._7_1_ =
         DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&MAGIC_ASSERT,(bool *)((long)&f_2.exception + 6));
    bVar1 = DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f_2.exception + 7));
    if (bVar1) {
      _kjDefer2082.maybeFunc.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2082:3)>_2
            )location.fileName;
      anon_unknown_173::RootEvent::RootEvent((RootEvent *)local_118,node,pollImpl,location);
      (*(node->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(node,(RootEvent *)local_118);
      *(undefined1 *)(_kjCondition._32_8_ + 8) = 1;
      local_150.loop = (EventLoop *)_kjCondition._32_8_;
      defer<kj::_::pollImpl(kj::_::PromiseNode&,kj::WaitScope&,kj::SourceLocation)::__0>
                ((kj *)local_148,&local_150);
      local_168.doneEvent = (RootEvent *)local_118;
      local_168.loop = (EventLoop *)_kjCondition._32_8_;
      local_168.node = node;
      WaitScope::
      runOnStackPool<kj::_::pollImpl(kj::_::PromiseNode&,kj::WaitScope&,kj::SourceLocation)::__1>
                (waitScope,&local_168);
      this = _kjCondition._32_8_;
      bVar1 = ((byte)doneEvent.super_Event.location.lineNumber & 1) != 0;
      if (bVar1) {
        runnable = EventLoop::isRunnable((EventLoop *)_kjCondition._32_8_);
        EventLoop::setRunnable((EventLoop *)this,runnable);
      }
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:2082:3)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2082:3)>
                   *)local_148);
      anon_unknown_173::RootEvent::~RootEvent((RootEvent *)local_118);
      return bVar1;
    }
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
              ((Fault *)&doneEvent.traceAddr,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81c,FAILED,"!loop.running",
               "_kjCondition,\"poll() is not allowed from within event callbacks.\"",
               (DebugExpression<bool> *)((long)&f_2.exception + 7),
               (char (*) [51])"poll() is not allowed from within event callbacks.");
    Debug::Fault::fatal((Fault *)&doneEvent.traceAddr);
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::FiberBase&>&,kj::None_const&>&,char_const(&)[35]>
            ((Fault *)&stack0xffffffffffffff50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x81b,FAILED,"waitScope.fiber == kj::none",
             "_kjCondition,\"poll() is not supported in fibers.\"",
             (DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)local_a0,
             (char (*) [35])"poll() is not supported in fibers.");
  Debug::Fault::fatal((Fault *)&stack0xffffffffffffff50);
}

Assistant:

bool pollImpl(_::PromiseNode& node, WaitScope& waitScope, SourceLocation location) {
  EventLoop& loop = waitScope.loop;
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(waitScope.fiber == kj::none, "poll() is not supported in fibers.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  RootEvent doneEvent(&node, reinterpret_cast<void*>(&pollImpl), location);
  node.onReady(&doneEvent);

  loop.running = true;
  KJ_DEFER(loop.running = false);

  waitScope.runOnStackPool([&]() {
    while (!doneEvent.fired) {
      if (!loop.turn()) {
        // No events in the queue.  Poll for I/O.
        loop.poll();

        if (!doneEvent.fired && !loop.isRunnable()) {
          // No progress. Give up.
          node.onReady(nullptr);
          loop.setRunnable(false);
          break;
        }
      }
    }
  });

  if (!doneEvent.fired) {
    return false;
  }

  loop.setRunnable(loop.isRunnable());
  return true;
}